

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

void __thiscall crnlib::crn_comp::crn_comp(crn_comp *this)

{
  undefined8 *puVar1;
  long lVar2;
  
  (this->super_itexture_comp)._vptr_itexture_comp = (_func_int **)&PTR__crn_comp_001b98b0;
  task_pool::task_pool(&this->m_task_pool);
  this->m_pParams = (crn_comp_params *)0x0;
  lVar2 = 0x318;
  do {
    puVar1 = (undefined8 *)((long)(this->m_task_pool).m_task_stack.m_stack + lVar2 + -0x28);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)(this->m_task_pool).m_task_stack.m_stack + lVar2 + -0x18) = 0xf;
    *(undefined8 *)((long)&(this->m_task_pool).m_task_stack.m_stack[0].m_data + lVar2) = 0;
    puVar1 = (undefined8 *)((long)(this->m_task_pool).m_task_stack.m_stack + lVar2 + -0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0x1518);
  (this->m_levels).m_p = (level_details *)0x0;
  (this->m_levels).m_size = 0;
  (this->m_levels).m_capacity = 0;
  (this->m_comp_data).m_p = (uchar *)0x0;
  (this->m_comp_data).m_size = 0;
  (this->m_comp_data).m_capacity = 0;
  (this->m_color_endpoints).m_p = (uint *)0x0;
  (this->m_color_endpoints).m_size = 0;
  (this->m_color_endpoints).m_capacity = 0;
  (this->m_alpha_endpoints).m_p = (uint *)0x0;
  (this->m_alpha_endpoints).m_size = 0;
  (this->m_alpha_endpoints).m_capacity = 0;
  (this->m_color_selectors).m_p = (uint *)0x0;
  (this->m_color_selectors).m_size = 0;
  (this->m_color_selectors).m_capacity = 0;
  (this->m_alpha_selectors).m_p = (unsigned_long_long *)0x0;
  (this->m_alpha_selectors).m_size = 0;
  (this->m_alpha_selectors).m_capacity = 0;
  (this->m_endpoint_indices).m_p = (endpoint_indices_details *)0x0;
  (this->m_endpoint_indices).m_size = 0;
  (this->m_endpoint_indices).m_capacity = 0;
  (this->m_selector_indices).m_p = (selector_indices_details *)0x0;
  (this->m_selector_indices).m_size = 0;
  (this->m_selector_indices).m_capacity = 0;
  dxt_hc::dxt_hc(&this->m_hvq);
  vector<unsigned_int>::vector(&(this->m_reference_hist).m_hist,0);
  static_huffman_data_model::static_huffman_data_model(&this->m_reference_dm);
  this->m_endpoint_remaping[1].m_p = (unsigned_short *)0x0;
  this->m_endpoint_remaping[1].m_size = 0;
  this->m_endpoint_remaping[1].m_capacity = 0;
  this->m_endpoint_remaping[0].m_p = (unsigned_short *)0x0;
  this->m_endpoint_remaping[0].m_size = 0;
  this->m_endpoint_remaping[0].m_capacity = 0;
  vector<unsigned_int>::vector(&this->m_endpoint_index_hist[0].m_hist,0);
  vector<unsigned_int>::vector(&this->m_endpoint_index_hist[1].m_hist,0);
  static_huffman_data_model::static_huffman_data_model
            ((static_huffman_data_model *)&this->field_0x1f10);
  static_huffman_data_model::static_huffman_data_model
            ((static_huffman_data_model *)&this->field_0x1f48);
  this->m_selector_remaping[1].m_p = (unsigned_short *)0x0;
  this->m_selector_remaping[1].m_size = 0;
  this->m_selector_remaping[1].m_capacity = 0;
  this->m_selector_remaping[0].m_p = (unsigned_short *)0x0;
  this->m_selector_remaping[0].m_size = 0;
  this->m_selector_remaping[0].m_capacity = 0;
  vector<unsigned_int>::vector(&this->m_selector_index_hist[0].m_hist,0);
  vector<unsigned_int>::vector(&this->m_selector_index_hist[1].m_hist,0);
  static_huffman_data_model::static_huffman_data_model
            ((static_huffman_data_model *)&this->field_0x1fc0);
  static_huffman_data_model::static_huffman_data_model
            ((static_huffman_data_model *)&this->field_0x1ff8);
  memset(this->m_packed_blocks,0,0x150);
  return;
}

Assistant:

crn_comp::crn_comp() :
        m_pParams(nullptr)
    {
    }